

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O0

void Dau_NetworkEnum(int nVars)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  abctime aVar8;
  word wVar9;
  Vec_Int_t *pVVar10;
  abctime aVar11;
  word wVar12;
  ulong uVar13;
  Vec_Int_t *local_1f8;
  word Cof11;
  word Cof10;
  word Cof01;
  word Cof00;
  word Cof1_1;
  word Cof0_1;
  word tCur_1;
  word tGate2;
  word tGate1;
  int nSupp_1;
  word uTruth_1;
  word Cof1;
  word Cof0;
  word tCur;
  word tGate;
  ulong uStack_160;
  int nSupp;
  word uTruth;
  Vec_Int_t *vFuncsN_;
  Vec_Int_t *vFuncsN;
  Vec_Int_t *vFuncsN1;
  Vec_Int_t *vFuncsN2;
  uint Inv;
  int Entry;
  int Res;
  int n;
  int m;
  int k;
  int g;
  int u;
  int v;
  int i;
  Vec_Wec_t *vNpns_;
  Vec_Wec_t *vNpns;
  uint *pTable;
  char pFileName [200];
  int nSizeW;
  int nSizeLog;
  int UseTwo;
  int Limit;
  abctime clk;
  int nVars_local;
  
  aVar8 = Abc_Clock();
  uVar1 = (1 << ((byte)nVars & 0x1f)) - 2;
  vNpns_ = Vec_WecStart(0x20);
  _v = Vec_WecStart(0x20);
  wVar9 = Abc_Tt6Mask(1 << ((byte)nVars - 1 & 0x1f));
  vFuncsN2._0_4_ = (uint)wVar9;
  sprintf((char *)&pTable,"tableW%d.data",(ulong)uVar1);
  vNpns = (Vec_Wec_t *)Dau_ReadFile((char *)&pTable,1 << ((byte)uVar1 & 0x1f));
  vNpns->nCap = vNpns->nCap | 0x80000000;
  (&vNpns->nCap)[(uint)vFuncsN2] = (&vNpns->nCap)[(uint)vFuncsN2] | 0x80000000;
  pVVar10 = Vec_WecEntry(vNpns_,0);
  Vec_IntPushTwo(pVVar10,0,(uint)vFuncsN2);
  pVVar10 = Vec_WecEntry(_v,0);
  Vec_IntPushTwo(pVVar10,0,(uint)vFuncsN2);
  pVVar10 = Vec_WecEntry(vNpns_,0);
  uVar1 = Vec_IntSize(pVVar10);
  uVar2 = Vec_WecSizeSize(vNpns_);
  pVVar10 = Vec_WecEntry(_v,0);
  uVar3 = Vec_IntSize(pVVar10);
  uVar4 = Vec_WecSizeSize(_v);
  printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ",0,(ulong)uVar1,
         (ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  aVar11 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar11 - aVar8);
  for (Entry = 1; Entry < 0x20; Entry = Entry + 1) {
    if (Entry < 2) {
      local_1f8 = (Vec_Int_t *)0x0;
    }
    else {
      local_1f8 = Vec_WecEntry(vNpns_,Entry + -2);
    }
    vFuncsN1 = local_1f8;
    vFuncsN = Vec_WecEntry(vNpns_,Entry + -1);
    vFuncsN_ = Vec_WecEntry(vNpns_,Entry);
    uTruth = (word)Vec_WecEntry(_v,Entry);
    for (u = 0; iVar6 = u, iVar5 = Vec_IntSize(vFuncsN), iVar7 = Entry, iVar6 < iVar5; u = u + 1) {
      vFuncsN2._4_4_ = Vec_IntEntry(vFuncsN,u);
      uStack_160 = (long)vFuncsN2._4_4_ << 0x20 | (long)vFuncsN2._4_4_;
      iVar7 = Abc_TtSupportSize(&stack0xfffffffffffffea0,nVars);
      if ((iVar7 != 6) && (iVar6 = Abc_Tt6HasVar(uStack_160,(nVars + -1) - iVar7), iVar6 != 0)) {
        __assert_fail("nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                      ,0xd3,"void Dau_NetworkEnum(int)");
      }
      for (g = 0; g < iVar7; g = g + 1) {
        wVar9 = Abc_Tt6Cofactor0(uStack_160,(nVars + -1) - g);
        wVar12 = Abc_Tt6Cofactor1(uStack_160,(nVars + -1) - g);
        for (m = 0; m < 2; m = m + 1) {
          if (iVar7 < nVars) {
            if (m == 0) {
              uVar13 = s_Truths6[(nVars + -1) - g] & s_Truths6[(nVars + -1) - iVar7];
              Dau_AddFunction(uVar13 & wVar12 | (uVar13 ^ 0xffffffffffffffff) & wVar9,nVars,
                              (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
              Dau_AddFunction(uVar13 & wVar9 | (uVar13 ^ 0xffffffffffffffff) & wVar12,nVars,
                              (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
            }
            else {
              Dau_AddFunction((s_Truths6[(nVars + -1) - g] ^ s_Truths6[(nVars + -1) - iVar7]) &
                              wVar12 | (s_Truths6[(nVars + -1) - g] ^
                                        s_Truths6[(nVars + -1) - iVar7] ^ 0xffffffffffffffff) &
                                       wVar9,nVars,(uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
            }
          }
        }
        for (m = 0; m < 2; m = m + 1) {
          for (n = 0; n < iVar7; n = n + 1) {
            if (n != g) {
              if (m == 0) {
                uVar13 = s_Truths6[(nVars + -1) - g] & s_Truths6[(nVars + -1) - n];
                Dau_AddFunction(uVar13 & wVar12 | (uVar13 ^ 0xffffffffffffffff) & wVar9,nVars,
                                (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                Dau_AddFunction(uVar13 & wVar9 | (uVar13 ^ 0xffffffffffffffff) & wVar12,nVars,
                                (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                uVar13 = s_Truths6[(nVars + -1) - g] &
                         (s_Truths6[(nVars + -1) - n] ^ 0xffffffffffffffff);
                Dau_AddFunction(uVar13 & wVar12 | (uVar13 ^ 0xffffffffffffffff) & wVar9,nVars,
                                (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                Dau_AddFunction(uVar13 & wVar9 | (uVar13 ^ 0xffffffffffffffff) & wVar12,nVars,
                                (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
              }
              else {
                Dau_AddFunction((s_Truths6[(nVars + -1) - g] ^ s_Truths6[(nVars + -1) - n]) & wVar12
                                | (s_Truths6[(nVars + -1) - g] ^ s_Truths6[(nVars + -1) - n] ^
                                  0xffffffffffffffff) & wVar9,nVars,(uint *)vNpns,vFuncsN_,
                                (Vec_Int_t *)uTruth);
              }
            }
          }
        }
        for (m = 0; m < 2; m = m + 1) {
          for (n = 0; n < iVar7; n = n + 1) {
            iVar6 = n;
            if (n != g) {
              while (Res = iVar6 + 1, Res < iVar7) {
                iVar6 = Res;
                if (Res != g) {
                  if (m == 0) {
                    uVar13 = s_Truths6[(nVars + -1) - Res] & s_Truths6[(nVars + -1) - n];
                    Dau_AddFunction(uVar13 & wVar12 | (uVar13 ^ 0xffffffffffffffff) & wVar9,nVars,
                                    (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                    Dau_AddFunction(uVar13 & wVar9 | (uVar13 ^ 0xffffffffffffffff) & wVar12,nVars,
                                    (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                    uVar13 = s_Truths6[(nVars + -1) - Res] &
                             (s_Truths6[(nVars + -1) - n] ^ 0xffffffffffffffff);
                    Dau_AddFunction(uVar13 & wVar12 | (uVar13 ^ 0xffffffffffffffff) & wVar9,nVars,
                                    (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                    Dau_AddFunction(uVar13 & wVar9 | (uVar13 ^ 0xffffffffffffffff) & wVar12,nVars,
                                    (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                    uVar13 = (s_Truths6[(nVars + -1) - Res] ^ 0xffffffffffffffff) &
                             s_Truths6[(nVars + -1) - n];
                    Dau_AddFunction(uVar13 & wVar12 | (uVar13 ^ 0xffffffffffffffff) & wVar9,nVars,
                                    (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                    Dau_AddFunction(uVar13 & wVar9 | (uVar13 ^ 0xffffffffffffffff) & wVar12,nVars,
                                    (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                    uVar13 = (s_Truths6[(nVars + -1) - Res] ^ 0xffffffffffffffff) &
                             (s_Truths6[(nVars + -1) - n] ^ 0xffffffffffffffff);
                    Dau_AddFunction(uVar13 & wVar12 | (uVar13 ^ 0xffffffffffffffff) & wVar9,nVars,
                                    (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                    Dau_AddFunction(uVar13 & wVar9 | (uVar13 ^ 0xffffffffffffffff) & wVar12,nVars,
                                    (uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth);
                    iVar6 = Res;
                  }
                  else {
                    Dau_AddFunction((s_Truths6[(nVars + -1) - Res] ^ s_Truths6[(nVars + -1) - n]) &
                                    wVar12 | (s_Truths6[(nVars + -1) - Res] ^
                                              s_Truths6[(nVars + -1) - n] ^ 0xffffffffffffffff) &
                                             wVar9,nVars,(uint *)vNpns,vFuncsN_,(Vec_Int_t *)uTruth)
                    ;
                    iVar6 = Res;
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar1 = Vec_IntSize(vFuncsN_);
    uVar2 = Vec_WecSizeSize(vNpns_);
    uVar3 = Vec_IntSize((Vec_Int_t *)uTruth);
    uVar4 = Vec_WecSizeSize(_v);
    printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ",(ulong)(uint)iVar7,
           (ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
    aVar11 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar11 - aVar8);
    fflush(_stdout);
    iVar7 = Vec_IntSize(vFuncsN_);
    if (iVar7 == 0) break;
  }
  Vec_WecFree(vNpns_);
  Vec_WecFree(_v);
  if (vNpns != (Vec_Wec_t *)0x0) {
    free(vNpns);
    vNpns = (Vec_Wec_t *)0x0;
  }
  aVar11 = Abc_Clock();
  Abc_PrintTime(1,"Total time",aVar11 - aVar8);
  fflush(_stdout);
  return;
}

Assistant:

void Dau_NetworkEnum(int nVars)
{
    abctime clk = Abc_Clock();
    int Limit = 2;
    int UseTwo = 0;
    int nSizeLog = (1<<nVars) -2;
    int nSizeW = 1 << nSizeLog;
    char pFileName[200];
    unsigned * pTable;
    Vec_Wec_t * vNpns  = Vec_WecStart( 32 );
    Vec_Wec_t * vNpns_ = Vec_WecStart( 32 );
    int i, v, u, g, k, m, n, Res, Entry;
    unsigned Inv = (unsigned)Abc_Tt6Mask(1 << (nVars-1));
    sprintf( pFileName, "tableW%d.data", nSizeLog );
    pTable  = Dau_ReadFile( pFileName, nSizeW );
    // create constant function and buffer/inverter function
    pTable[0]   |= (1 << 31);
    pTable[Inv] |= (1 << 31);
    Vec_IntPushTwo( Vec_WecEntry(vNpns,  0), 0, Inv );
    Vec_IntPushTwo( Vec_WecEntry(vNpns_, 0), 0, Inv );
    printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ", 
        0, Vec_IntSize(Vec_WecEntry(vNpns,  0)), Vec_WecSizeSize(vNpns), 
           Vec_IntSize(Vec_WecEntry(vNpns_, 0)), Vec_WecSizeSize(vNpns_) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // numerate other functions based on how many nodes they have
    for ( n = 1; n < 32; n++ )
    {
        Vec_Int_t * vFuncsN2 = n > 1 ? Vec_WecEntry( vNpns, n-2 ) : NULL;
        Vec_Int_t * vFuncsN1 = Vec_WecEntry( vNpns, n-1 );
        Vec_Int_t * vFuncsN  = Vec_WecEntry( vNpns, n   );
        Vec_Int_t * vFuncsN_ = Vec_WecEntry( vNpns_,n   );
        Vec_IntForEachEntry( vFuncsN1, Entry, i )
        {
            word uTruth = (((word)Entry) << 32) | (word)Entry;
            int nSupp = Abc_TtSupportSize( &uTruth, nVars );
            assert( nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ )
            {
                word tGate, tCur;
                word Cof0 = Abc_Tt6Cofactor0( uTruth, nVars-1-v );
                word Cof1 = Abc_Tt6Cofactor1( uTruth, nVars-1-v );
                for ( g = 0; g < Limit; g++ )
                {
                    if ( nSupp < nVars )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-nSupp];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-nSupp];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
                for ( g = 0; g < Limit; g++ )
                {
                    // add one cross bar
                    for ( k = 0; k < nSupp; k++ ) if ( k != v )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = s_Truths6[nVars-1-v] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
                for ( g = 0; g < Limit; g++ )
                {
                    // add two cross bars
                    for ( k = 0;   k < nSupp; k++ ) if ( k != v )
                    for ( m = k+1; m < nSupp; m++ ) if ( m != v )
                    {
                        if ( g == 0 )
                        {
                            tGate = s_Truths6[nVars-1-m] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = s_Truths6[nVars-1-m] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = ~s_Truths6[nVars-1-m] & s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tGate = ~s_Truths6[nVars-1-m] & ~s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );

                            tCur  = (tGate & Cof0) | (~tGate & Cof1);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                        else
                        {
                            tGate = s_Truths6[nVars-1-m] ^ s_Truths6[nVars-1-k];
                            tCur  = (tGate & Cof1) | (~tGate & Cof0);
                            Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                        }
                    }
                }
            }
        }
        if ( UseTwo && vFuncsN2 )
        Vec_IntForEachEntry( vFuncsN2, Entry, i )
        {
            word uTruth = (((word)Entry) << 32) | (word)Entry;
            int nSupp = Abc_TtSupportSize( &uTruth, nVars );
            assert( nSupp == 6 || !Abc_Tt6HasVar(uTruth, nVars-1-nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ )
//            for ( u = v+1; u < nSupp; u++ ) if ( u != v )
            for ( u = 0; u < nSupp; u++ ) if ( u != v )
            {
                word tGate1, tGate2, tCur;
                word Cof0 = Abc_Tt6Cofactor0( uTruth, nVars-1-v );
                word Cof1 = Abc_Tt6Cofactor1( uTruth, nVars-1-v );

                word Cof00 = Abc_Tt6Cofactor0( Cof0, nVars-1-u );
                word Cof01 = Abc_Tt6Cofactor1( Cof0, nVars-1-u );
                word Cof10 = Abc_Tt6Cofactor0( Cof1, nVars-1-u );
                word Cof11 = Abc_Tt6Cofactor1( Cof1, nVars-1-u );

                tGate1 = s_Truths6[nVars-1-v] & s_Truths6[nVars-1-u];
                tGate2 = s_Truths6[nVars-1-v] ^ s_Truths6[nVars-1-u];

                Cof0  = (tGate2 & Cof00) | (~tGate2 & Cof01);
                Cof1  = (tGate2 & Cof10) | (~tGate2 & Cof11);

                tCur  = (tGate1 & Cof1)  | (~tGate1 & Cof0);
                Res = Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                if ( Res )
                    printf( "Found function %d\n", Res );

                tCur  = (tGate1 & Cof0)  | (~tGate1 & Cof1);
                Res = Dau_AddFunction( tCur, nVars, pTable, vFuncsN, vFuncsN_ );
                if ( Res )
                    printf( "Found function %d\n", Res );
            }
        }
        printf("Nodes = %2d.   New = %6d. Total = %6d.   New = %6d. Total = %6d.  ", 
            n, Vec_IntSize(vFuncsN), Vec_WecSizeSize(vNpns), Vec_IntSize(vFuncsN_), Vec_WecSizeSize(vNpns_) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        fflush(stdout);
        if ( Vec_IntSize(vFuncsN) == 0 )
            break;
    }
//    printf( "Functions with 7 nodes:\n" );
//    Vec_IntForEachEntry( Vec_WecEntry(vNpns_,7), Entry, i )
//        printf( "%04x ", Entry );
//    printf( "\n" );

    Vec_WecFree( vNpns );
    Vec_WecFree( vNpns_ );
    ABC_FREE( pTable );
    Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    fflush(stdout);
}